

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::GlobalObject::GetPropertyQuery
          (GlobalObject *this,Var originalInstance,JavascriptString *propertyNameString,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)requestContext;
  ScriptContext::GetOrAddPropertyRecord
            ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
             propertyNameString,&local_40);
  PVar1 = GetPropertyQuery(this,originalInstance,local_40->pid,value,info,
                           (ScriptContext *)propertyRecord);
  return PVar1;
}

Assistant:

PropertyQueryFlags GlobalObject::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return GlobalObject::GetPropertyQuery(originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }